

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_scalar.c
# Opt level: O1

void scalar_getrect(t_gobj *z,_glist *owner,int *xp1,int *yp1,int *xp2,int *yp2)

{
  _glist *p_Var1;
  _parentwidgetbehavior *p_Var2;
  int iVar3;
  int iVar4;
  int iVar5;
  t_gobj *x;
  int iVar6;
  t_float tVar7;
  t_float basey;
  t_float basex;
  t_float local_78;
  t_float local_74;
  int ny2;
  int nx2;
  int ny1;
  int nx1;
  int *local_60;
  int *local_58;
  int *local_50;
  int *local_48;
  _glist *local_40;
  t_template *local_38;
  
  local_60 = xp1;
  local_58 = yp1;
  local_50 = xp2;
  local_48 = yp2;
  local_38 = template_findbyname((t_symbol *)z[1].g_pd);
  p_Var1 = template_findcanvas(local_38);
  scalar_getbasexy((t_scalar *)z,&basex,&basey);
  if (p_Var1 == (_glist *)0x0) {
    tVar7 = glist_xtopixels(owner,basex);
    iVar6 = (int)tVar7;
    tVar7 = glist_ytopixels(owner,basey);
    iVar4 = (int)tVar7;
    iVar3 = iVar6;
    iVar5 = iVar4;
  }
  else {
    x = p_Var1->gl_list;
    if (x == (t_gobj *)0x0) {
      iVar4 = 0x7fffffff;
      iVar3 = -0x7fffffff;
      iVar5 = -0x7fffffff;
      iVar6 = 0x7fffffff;
    }
    else {
      local_74 = basex;
      iVar5 = -0x7fffffff;
      iVar6 = 0x7fffffff;
      local_78 = basey;
      iVar4 = 0x7fffffff;
      iVar3 = -0x7fffffff;
      local_40 = owner;
      do {
        p_Var2 = pd_getparentwidget(&x->g_pd);
        if (p_Var2 != (_parentwidgetbehavior *)0x0) {
          (*p_Var2->w_parentgetrectfn)
                    (x,local_40,(t_word *)&z[1].g_next,local_38,local_74,local_78,&nx1,&ny1,&nx2,
                     &ny2);
          if (nx1 < iVar6) {
            iVar6 = nx1;
          }
          if (ny1 < iVar4) {
            iVar4 = ny1;
          }
          if (iVar3 < nx2) {
            iVar3 = nx2;
          }
          if (iVar5 < ny2) {
            iVar5 = ny2;
          }
        }
        x = x->g_next;
      } while (x != (_gobj *)0x0);
    }
    if ((iVar3 < iVar6) || (iVar5 < iVar4)) {
      iVar4 = 0;
      iVar6 = 0;
      iVar3 = 0;
      iVar5 = 0;
    }
  }
  *local_60 = iVar6;
  *local_58 = iVar4;
  *local_50 = iVar3;
  *local_48 = iVar5;
  return;
}

Assistant:

static void scalar_getrect(t_gobj *z, t_glist *owner,
    int *xp1, int *yp1, int *xp2, int *yp2)
{
    t_scalar *x = (t_scalar *)z;
    t_template *template = template_findbyname(x->sc_template);
    t_canvas *templatecanvas = template_findcanvas(template);
    int x1 = 0x7fffffff, x2 = -0x7fffffff, y1 = 0x7fffffff, y2 = -0x7fffffff;
    t_gobj *y;
    t_float basex, basey;
    scalar_getbasexy(x, &basex, &basey);
        /* if someone deleted the template canvas, we're just a point */
    if (!templatecanvas)
    {
        x1 = x2 = glist_xtopixels(owner, basex);
        y1 = y2 = glist_ytopixels(owner, basey);
    }
    else
    {
        x1 = y1 = 0x7fffffff;
        x2 = y2 = -0x7fffffff;
        for (y = templatecanvas->gl_list; y; y = y->g_next)
        {
            const t_parentwidgetbehavior *wb = pd_getparentwidget(&y->g_pd);
            int nx1, ny1, nx2, ny2;
            if (!wb) continue;
            (*wb->w_parentgetrectfn)(y, owner,
                x->sc_vec, template, basex, basey,
                &nx1, &ny1, &nx2, &ny2);
            if (nx1 < x1) x1 = nx1;
            if (ny1 < y1) y1 = ny1;
            if (nx2 > x2) x2 = nx2;
            if (ny2 > y2) y2 = ny2;
        }
        if (x2 < x1 || y2 < y1)
            x1 = y1 = x2 = y2 = 0;
    }
    /* post("scalar x1 %d y1 %d x2 %d y2 %d", x1, y1, x2, y2); */
    *xp1 = x1;
    *yp1 = y1;
    *xp2 = x2;
    *yp2 = y2;
}